

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replay.c
# Opt level: O1

void replay(void)

{
  uint uVar1;
  nh_bool nVar2;
  int iVar3;
  nh_log_status status;
  wchar_t wVar4;
  fnchar **ppfVar5;
  nh_menuitem_conflict *pnVar6;
  undefined4 uVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  nh_menuitem *_item_;
  char *pcVar11;
  long lVar12;
  wchar_t filecount;
  wchar_t pick [1];
  fnchar savedir [256];
  fnchar logdir [256];
  nh_game_info gi;
  fnchar filename [1024];
  char buf [256];
  int local_924;
  ulong local_920;
  wchar_t local_914;
  nh_menuitem_conflict *local_910;
  fnchar **local_908;
  char *local_900;
  char local_8f8 [512];
  nh_game_info_conflict local_6f8;
  char local_538 [1024];
  char local_138 [264];
  
  nVar2 = get_gamedir(LOG_DIR,local_8f8 + 0x100);
  if (nVar2 == '\0') {
    local_8f8[0x100] = '\0';
  }
  nVar2 = get_gamedir(SAVE_DIR,local_8f8);
  if (nVar2 == '\0') {
    local_8f8[0] = '\0';
  }
  pcVar8 = local_8f8 + 0x100;
  if (local_8f8[0x100] == '\0') {
    if (local_8f8[0] == '\0') {
      curses_msgwin("There are no games to replay.");
      return;
    }
    pcVar8 = local_8f8;
  }
  do {
    while( true ) {
      pcVar11 = local_8f8 + 0x100;
      local_538[0] = '\0';
      ppfVar5 = list_gamefiles(pcVar8,&local_924);
      iVar3 = local_924;
      if ((long)local_924 != 0) break;
      if (pcVar8 == local_8f8) {
        curses_msgwin("There are no saved games to replay.");
        local_8f8[0] = '\0';
      }
      else {
        curses_msgwin("There are no completed games to replay.");
        local_8f8[0x100] = '\0';
        pcVar11 = local_8f8;
      }
      pcVar8 = pcVar11;
      if (*pcVar11 == '\0') {
        return;
      }
    }
    local_920 = (long)local_924 + 2;
    pnVar6 = (nh_menuitem_conflict *)malloc(local_920 * 0x10c);
    if ((pcVar8 == pcVar11) && (local_8f8[0] != '\0')) {
      if (iVar3 < -1) {
        uVar1 = (int)local_920 * 2;
        pnVar6 = (nh_menuitem_conflict *)realloc(pnVar6,(long)(int)uVar1 * 0x10c);
        local_920 = (ulong)uVar1;
      }
      pnVar6->id = L'\xffffffff';
      pnVar6->role = MI_NORMAL;
      pnVar6->accel = '!';
      pnVar6->group_accel = '\0';
      pnVar6->selected = '\0';
      builtin_strncpy(pnVar6->caption,"View saved games instead",0x19);
      iVar3 = (int)local_920;
joined_r0x00115649:
      if (iVar3 < 2) {
        uVar1 = (int)local_920 * 2;
        local_920 = (ulong)uVar1;
        pnVar6 = (nh_menuitem_conflict *)realloc(pnVar6,(long)(int)uVar1 * 0x10c);
      }
      pnVar6[1].id = L'\0';
      pnVar6[1].role = MI_NORMAL;
      pnVar6[1].accel = '\0';
      pnVar6[1].group_accel = '\0';
      pnVar6[1].selected = '\0';
      pnVar6[1].caption[0] = '\0';
      lVar10 = 2;
    }
    else {
      lVar10 = 0;
      if ((pcVar8 == local_8f8) && (local_8f8[0x100] != '\0')) {
        if (iVar3 < -1) {
          uVar1 = (int)local_920 * 2;
          pnVar6 = (nh_menuitem_conflict *)realloc(pnVar6,(long)(int)uVar1 * 0x10c);
          local_920 = (ulong)uVar1;
        }
        pnVar6->id = L'\xffffffff';
        pnVar6->role = MI_NORMAL;
        pnVar6->accel = '!';
        pnVar6->group_accel = '\0';
        pnVar6->selected = '\0';
        builtin_strncpy(pnVar6->caption,"View completed games instead",0x1d);
        iVar3 = (int)local_920;
        goto joined_r0x00115649;
      }
    }
    pcVar11 = pcVar8;
    local_910 = pnVar6;
    local_908 = ppfVar5;
    if (0 < local_924) {
      lVar12 = lVar10 * 0x10c + 0x10a;
      lVar9 = 0;
      local_900 = pcVar8;
      do {
        iVar3 = open(local_908[lVar9],2,0x1b0);
        status = nh_get_savegame_status(iVar3,&local_6f8);
        close(iVar3);
        describe_game(local_138,status,&local_6f8);
        if ((int)local_920 <= lVar10) {
          uVar1 = (int)local_920 * 2;
          local_920 = (ulong)uVar1;
          local_910 = (nh_menuitem_conflict *)realloc(local_910,(long)(int)uVar1 * 0x10c);
        }
        lVar9 = lVar9 + 1;
        uVar7 = (undefined4)lVar9;
        if (status == LS_IN_PROGRESS) {
          uVar7 = 0;
        }
        pcVar8 = local_910->caption + lVar12 + -8;
        *(undefined4 *)(pcVar8 + -0x10a) = uVar7;
        *(undefined4 *)(pcVar8 + -0x106) = 1;
        *(undefined2 *)(pcVar8 + -2) = MI_TEXT >> 0x10;
        *pcVar8 = '\0';
        strcpy(pcVar8 + -0x102,local_138);
        lVar10 = lVar10 + 1;
        lVar12 = lVar12 + 0x10c;
        pcVar11 = local_900;
      } while (lVar9 < local_924);
    }
    pnVar6 = local_910;
    pcVar8 = "Pick a completed game to view";
    if (pcVar11 == local_8f8) {
      pcVar8 = "Pick a saved game to view";
    }
    wVar4 = curses_display_menu(local_910,(wchar_t)lVar10,pcVar8,L'\x01',&local_914);
    free(pnVar6);
    local_538[0] = '\0';
    if (local_914 != L'\xffffffff' && L'\0' < wVar4) {
      strncat(local_538,local_908[(long)local_914 + -1],0x3ff);
    }
    ppfVar5 = local_908;
    if (0 < local_924) {
      lVar10 = 0;
      do {
        free(ppfVar5[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 < local_924);
    }
    free(ppfVar5);
    if (wVar4 < L'\x01') {
      return;
    }
    if (local_914 != L'\xffffffff') {
      wVar4 = open(local_538,2,0x1b0);
      replay_commandloop(wVar4);
      close(wVar4);
      return;
    }
    pcVar8 = local_8f8;
    if (pcVar11 == local_8f8) {
      pcVar8 = local_8f8 + 0x100;
    }
  } while( true );
}

Assistant:

void replay(void)
{
    char buf[BUFSZ];
    fnchar logdir[BUFSZ], savedir[BUFSZ], filename[1024], *dir, **files;
    struct nh_menuitem *items;
    int i, n, fd, icount, size, filecount, pick[1];
    enum nh_log_status status;
    struct nh_game_info gi;
    
    if (!get_gamedir(LOG_DIR, logdir))	logdir[0] = '\0';
    if (!get_gamedir(SAVE_DIR, savedir))savedir[0] = '\0';
    
    if (*logdir)	dir = logdir;
    else if (*savedir)	dir = savedir;
    else {
	curses_msgwin("There are no games to replay.");
	return;
    }
    
    while (1) {
	filename[0] = '\0';
	files = list_gamefiles(dir, &filecount);
	/* make sure there are some files to show */
	if (!filecount) {
	    if (dir == savedir) {
		curses_msgwin("There are no saved games to replay.");
		savedir[0] = '\0';
	    } else {
		curses_msgwin("There are no completed games to replay.");
		logdir[0] = '\0';
	    }
	    
	    dir = (dir == savedir) ? logdir : savedir;
	    if (!*dir) return;
	    continue;
	}
	
	icount = 0;
	size = filecount + 2;
	items = malloc(size * sizeof(struct nh_menuitem));

	if (dir == logdir && *savedir) {
	    add_menu_item(items, size, icount, -1,
			  "View saved games instead", '!', FALSE);
	    add_menu_txt(items, size, icount, "", MI_NORMAL);
	} else if (dir == savedir && *logdir) {
	    add_menu_item(items, size, icount, -1,
			  "View completed games instead", '!', FALSE);
	    add_menu_txt(items, size, icount, "", MI_NORMAL);
	}

	/* add all the files to the menu */
	for (i = 0; i < filecount; i++) {
	    fd = sys_open(files[i], O_RDWR, 0660);
	    status = nh_get_savegame_status(fd, &gi);
	    close(fd);
	    
	    describe_game(buf, status, &gi);
	    add_menu_item(items, size, icount,
			    (status == LS_IN_PROGRESS) ? 0 : i + 1,
			    buf, 0, FALSE);
	}

	n = curses_display_menu(items, icount,
				(dir == savedir ?
				 "Pick a saved game to view" :
				 "Pick a completed game to view"),
				PICK_ONE, pick);
	free(items);
	filename[0] = '\0';
	if (n > 0 && pick[0] != -1)
	    fnncat(filename, files[pick[0]-1], sizeof(filename)/sizeof(fnchar)-1);
	
	for (i = 0; i < filecount; i++)
	    free(files[i]);
	free(files);
	
	if (n <= 0)
	    return;
	
	if (pick[0] == -1) {
	    dir = (dir == savedir) ? logdir : savedir;
	    continue;
	}
	
	/* we have a valid filename */
	break;
    }
    
    fd = sys_open(filename, O_RDWR, 0660);
    replay_commandloop(fd);
    close(fd);
}